

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

iterator * __thiscall QTextFrame::iterator::operator--(iterator *this)

{
  byte bVar1;
  uint uVar2;
  QTextDocumentPrivate *this_00;
  QTextFrame *pQVar3;
  iterator *in_RDI;
  long in_FS_OFFSET;
  QTextFrame *pf;
  int pos;
  int start;
  BlockMap *map;
  QTextDocumentPrivate *priv;
  FragmentIterator frag;
  uint in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  byte in_stack_ffffffffffffff3e;
  byte in_stack_ffffffffffffff3f;
  QTextDocumentPrivate *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  QTextDocumentPrivate *in_stack_ffffffffffffff58;
  QChar local_7a [15];
  char16_t local_5c;
  QChar local_5a [15];
  char16_t local_3c;
  QChar local_3a [16];
  char16_t local_1a;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QTextDocumentPrivate::get((QTextObject *)0x88ce03);
  QTextDocumentPrivate::blockMap(this_00);
  if (in_RDI->cf == (QTextFrame *)0x0) {
    if (in_RDI->cb != in_RDI->b) {
      if (in_RDI->cb != in_RDI->e) {
        QFragmentMap<QTextBlockData>::position
                  ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff40,
                   CONCAT13(in_stack_ffffffffffffff3f,
                            CONCAT12(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)),
                   in_stack_ffffffffffffff38);
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QTextDocumentPrivate::find
                  ((QTextDocumentPrivate *)
                   CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                   (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        QTextDocumentPrivate::buffer
                  ((QTextDocumentPrivate *)
                   CONCAT17(in_stack_ffffffffffffff3f,
                            CONCAT16(in_stack_ffffffffffffff3e,
                                     CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)))
                  );
        QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x88cf02);
        local_1a = (char16_t)
                   QString::at((QString *)
                               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                               (qsizetype)in_stack_ffffffffffffff40);
        QChar::QChar<QChar::SpecialCharacter,_true>(local_3a,ParagraphSeparator);
        bVar1 = ::operator!=((QChar *)in_stack_ffffffffffffff40,
                             (QChar *)CONCAT17(in_stack_ffffffffffffff3f,
                                               CONCAT16(in_stack_ffffffffffffff3e,
                                                        CONCAT24(in_stack_ffffffffffffff3c,
                                                                 in_stack_ffffffffffffff38))));
        QString::~QString((QString *)0x88cf53);
        if ((bVar1 & 1) != 0) {
          QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x88cf77);
          QTextDocumentPrivate::objectForFormat
                    (in_stack_ffffffffffffff58,(int)((ulong)in_RDI >> 0x20));
          pQVar3 = qobject_cast<QTextFrame*>((QObject *)0x88cf8c);
          in_stack_ffffffffffffff40 = this_00;
          if (pQVar3 != (QTextFrame *)0x0) {
            QTextDocumentPrivate::buffer
                      ((QTextDocumentPrivate *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,
                                         CONCAT24(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38))));
            QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x88cfb9);
            local_3c = (char16_t)
                       QString::at((QString *)CONCAT17(bVar1,in_stack_ffffffffffffff48),
                                   (qsizetype)this_00);
            QChar::QChar<char16_t,_true>(local_5a,L'﷐');
            in_stack_ffffffffffffff3f =
                 ::operator==((QChar *)this_00,
                              (QChar *)CONCAT17(in_stack_ffffffffffffff3f,
                                                CONCAT16(in_stack_ffffffffffffff3e,
                                                         CONCAT24(in_stack_ffffffffffffff3c,
                                                                  in_stack_ffffffffffffff38))));
            QString::~QString((QString *)0x88cffe);
            in_stack_ffffffffffffff40 = this_00;
            if ((in_stack_ffffffffffffff3f & 1) == 0) {
              QTextDocumentPrivate::buffer
                        ((QTextDocumentPrivate *)
                         CONCAT17(in_stack_ffffffffffffff3f,
                                  CONCAT16(in_stack_ffffffffffffff3e,
                                           CONCAT24(in_stack_ffffffffffffff3c,
                                                    in_stack_ffffffffffffff38))));
              QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x88d026);
              local_5c = (char16_t)
                         QString::at((QString *)CONCAT17(bVar1,in_stack_ffffffffffffff48),
                                     (qsizetype)this_00);
              QChar::QChar<char16_t,_true>(local_7a,L'﷑');
              in_stack_ffffffffffffff3e =
                   ::operator==((QChar *)this_00,
                                (QChar *)CONCAT17(in_stack_ffffffffffffff3f,
                                                  CONCAT16(in_stack_ffffffffffffff3e,
                                                           CONCAT24(in_stack_ffffffffffffff3c,
                                                                    in_stack_ffffffffffffff38))));
              QString::~QString((QString *)0x88d065);
              in_stack_ffffffffffffff40 = this_00;
              if ((in_stack_ffffffffffffff3e & 1) != 0) {
                in_RDI->cf = pQVar3;
                in_RDI->cb = 0;
                goto LAB_0088d0ac;
              }
            }
          }
        }
      }
      uVar2 = QFragmentMap<QTextBlockData>::previous
                        ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff40,
                         CONCAT13(in_stack_ffffffffffffff3f,
                                  CONCAT12(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)));
      in_RDI->cb = uVar2;
    }
  }
  else {
    firstPosition((QTextFrame *)
                  CONCAT17(in_stack_ffffffffffffff3f,
                           CONCAT16(in_stack_ffffffffffffff3e,
                                    CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))))
    ;
    uVar2 = QFragmentMap<QTextBlockData>::findNode
                      ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff40,
                       CONCAT13(in_stack_ffffffffffffff3f,
                                CONCAT12(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)),
                       in_stack_ffffffffffffff38);
    in_RDI->cb = uVar2;
    in_RDI->cf = (QTextFrame *)0x0;
  }
LAB_0088d0ac:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QTextFrame::iterator &QTextFrame::iterator::operator--()
{
    const QTextDocumentPrivate *priv = QTextDocumentPrivate::get(f);
    const QTextDocumentPrivate::BlockMap &map = priv->blockMap();
    if (cf) {
        int start = cf->firstPosition() - 1;
        cb = map.findNode(start);
        cf = nullptr;
    } else {
        if (cb == b)
            goto end;
        if (cb != e) {
            int pos = map.position(cb);
            // check if we have to enter a frame
            QTextDocumentPrivate::FragmentIterator frag = priv->find(pos-1);
            if (priv->buffer().at(frag->stringPosition) != QChar::ParagraphSeparator) {
                QTextFrame *pf = qobject_cast<QTextFrame *>(priv->objectForFormat(frag->format));
                if (pf) {
                    if (priv->buffer().at(frag->stringPosition) == QTextBeginningOfFrame) {
                        Q_ASSERT(pf == f);
                    } else if (priv->buffer().at(frag->stringPosition) == QTextEndOfFrame) {
                        Q_ASSERT(pf != f);
                        cf = pf;
                        cb = 0;
                        goto end;
                    }
                }
            }
        }
        cb = map.previous(cb);
    }
 end:
    return *this;
}